

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

bool __thiscall libcellml::ComponentEntity::removeComponent(ComponentEntity *this,size_t index)

{
  Component *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ComponentImpl *this_02;
  long lVar1;
  size_type sVar2;
  EntityImpl *pEVar3;
  ulong uVar4;
  
  pEVar3 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar3[2].mId.field_2._M_allocated_capacity;
  uVar4 = (long)(*(long *)((long)&pEVar3[2].mId.field_2 + 8) - sVar2) >> 4;
  if (index < uVar4) {
    lVar1 = index * 0x10;
    this_00 = *(Component **)(sVar2 + lVar1);
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar2 + 8 + lVar1);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
        pEVar3 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        sVar2 = pEVar3[2].mId.field_2._M_allocated_capacity;
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::_M_erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                *)&pEVar3[2].mId.field_2,(shared_ptr<libcellml::Component> *)(sVar2 + lVar1));
    this_02 = Component::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_02);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  return index < uVar4;
}

Assistant:

bool ComponentEntity::removeComponent(size_t index)
{
    bool status = false;
    if (index < pFunc()->mComponents.size()) {
        auto component = pFunc()->mComponents[index];
        pFunc()->mComponents.erase(pFunc()->mComponents.begin() + ptrdiff_t(index));
        component->pFunc()->removeParent();
        status = true;
    }

    return status;
}